

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceDefinitionUtil.cpp
# Opt level: O3

bool deqp::gles31::Functional::anon_unknown_3::traverseVariablePath
               (vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                *typePath,string *path,VariableDeclaration *var)

{
  size_t __n;
  int iVar1;
  bool bVar2;
  Data local_48;
  undefined4 local_40;
  undefined4 uStack_3c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  glu::parseVariableName_abi_cxx11_((string *)&local_48,(glu *)(path->_M_dataplus)._M_p,(char *)var)
  ;
  __n = CONCAT44(uStack_3c,local_40);
  if (__n == (var->name)._M_string_length) {
    if (__n == 0) {
      bVar2 = false;
    }
    else {
      iVar1 = bcmp(local_48.type,(var->name)._M_dataplus._M_p,__n);
      bVar2 = iVar1 != 0;
    }
  }
  else {
    bVar2 = true;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.type != &local_38) {
    operator_delete(local_48.type,local_38._M_allocated_capacity + 1);
  }
  if (bVar2) {
    bVar2 = false;
  }
  else {
    local_40 = 2;
    local_48.declaration = var;
    std::
    vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
    ::emplace_back<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>
              (typePath,(VariablePathComponent *)&local_48);
    bVar2 = traverseVariablePath
                      (typePath,(path->_M_dataplus)._M_p + (var->name)._M_string_length,
                       &var->varType);
  }
  return bVar2;
}

Assistant:

static bool traverseVariablePath (std::vector<VariablePathComponent>& typePath, const std::string& path, const glu::VariableDeclaration& var)
{
	if (glu::parseVariableName(path.c_str()) != var.name)
		return false;

	typePath.push_back(VariablePathComponent(&var));
	return traverseVariablePath(typePath, path.c_str() + var.name.length(), var.varType);
}